

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  long lVar1;
  size_t *psVar2;
  int64_t *piVar3;
  byte bVar4;
  uint32_t uVar5;
  _7zip *zip;
  unsigned_long uVar6;
  uint64_t uVar7;
  lzma_ret lVar8;
  int iVar9;
  Bool BVar10;
  uchar *puVar11;
  void *pvVar12;
  uint8_t *__src;
  ssize_t sVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  uint64_t uVar22;
  byte *pbVar23;
  byte *pbVar24;
  uint uVar25;
  uint uVar26;
  uchar *puVar27;
  size_t sVar28;
  byte *pbVar29;
  size_t sVar30;
  ulong uVar31;
  size_t sVar32;
  ulong in_R11;
  long lVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  ssize_t bytes_avail;
  uint local_e4;
  uint64_t local_b8;
  uchar *local_b0;
  ulong local_a8;
  ulong local_a0;
  size_t local_98;
  size_t local_90;
  bz_stream *local_88;
  CPpmd7z_RangeDec *local_80;
  lzma_stream *local_78;
  code *local_70;
  IByteIn *local_68;
  uchar *local_60;
  size_t local_58;
  z_streamp local_50;
  CPpmd7 *local_48;
  code *local_40;
  size_t local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar12 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_a8);
    if (0 < (long)local_a8 && pvVar12 != (void *)0x0) {
      if (zip->pack_stream_inbytes_remaining < local_a8) {
        local_a8 = zip->pack_stream_inbytes_remaining;
      }
      zip->pack_stream_inbytes_remaining = zip->pack_stream_inbytes_remaining - local_a8;
      if (zip->folder_outbytes_remaining < local_a8) {
        local_a8 = zip->folder_outbytes_remaining;
      }
      zip->folder_outbytes_remaining = zip->folder_outbytes_remaining - local_a8;
      zip->uncompressed_buffer_bytes_remaining = local_a8;
      return 0;
    }
    pcVar19 = "Truncated 7-Zip file body";
    iVar9 = 0x54;
    goto LAB_00607035;
  }
  puVar11 = zip->uncompressed_buffer;
  local_58 = minimum;
  if (puVar11 == (uchar *)0x0) {
    sVar18 = 0x10000;
    if (0x10000 < minimum) {
      sVar18 = minimum + 0x3ff & 0xfffffffffffffc00;
    }
    zip->uncompressed_buffer_size = sVar18;
    puVar11 = (uchar *)malloc(sVar18);
    zip->uncompressed_buffer = puVar11;
    if (puVar11 == (uchar *)0x0) {
      pcVar19 = "No memory for 7-Zip decompression";
      iVar9 = 0xc;
      goto LAB_00607035;
    }
LAB_00606359:
    zip->uncompressed_buffer_bytes_remaining = 0;
  }
  else {
    if ((minimum <= zip->uncompressed_buffer_size) &&
       (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_00606359;
    lVar33 = (long)zip->uncompressed_buffer_pointer - (long)puVar11;
    if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
      lVar33 = 0;
    }
    if (zip->uncompressed_buffer_size < minimum) {
      uVar21 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar11 = (uchar *)realloc(puVar11,uVar21);
      if (puVar11 == (uchar *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      zip->uncompressed_buffer = puVar11;
      zip->uncompressed_buffer_size = uVar21;
    }
    if (lVar33 != 0) {
      memmove(zip->uncompressed_buffer,zip->uncompressed_buffer + lVar33,
              zip->uncompressed_buffer_bytes_remaining);
    }
  }
  zip->uncompressed_buffer_pointer = (uchar *)0x0;
  local_68 = &zip->bytein;
  local_80 = &zip->range_dec;
  local_70 = Ppmd7z_RangeDec_Init;
  local_40 = Ppmd7_DecodeSymbol;
  local_48 = &zip->ppmd7_context;
  local_50 = &zip->stream;
  local_88 = &zip->bzstream;
  local_78 = &zip->lzstream;
  local_60 = zip->odd_bcj;
  do {
    __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_a8);
    if ((long)local_a8 < 1) {
      iVar9 = 0x54;
      pcVar19 = "Truncated 7-Zip file body";
LAB_0060651c:
      archive_set_error(&a->archive,iVar9,pcVar19);
      iVar9 = 1;
    }
    else {
      local_38 = zip->uncompressed_buffer_size;
      local_90 = zip->uncompressed_buffer_bytes_remaining;
      puVar11 = zip->uncompressed_buffer + local_90;
      local_a0 = local_38 - local_90;
      uVar21 = zip->pack_stream_inbytes_remaining;
      uVar16 = local_a8;
      if (uVar21 <= local_a8) {
        uVar16 = uVar21;
      }
      local_e4 = 0;
      sVar30 = local_a0;
      sVar32 = local_a0;
      uVar22 = uVar16;
      local_b0 = puVar11;
      if ((zip->codec == 0x21) || (zip->codec2 != 0x3030103)) {
LAB_00606620:
        sVar14 = sVar30;
        puVar27 = local_b0;
        if (zip->codec2 == 0x303011b) {
          sVar14 = zip->tmp_stream_bytes_remaining;
          if (sVar14 != 0) {
            sVar13 = Bcj2_Decode(zip,local_b0,sVar30);
            if (sVar13 < 0) {
              bVar34 = false;
              archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
              in_R11 = 0xffffffe7;
            }
            else {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar14);
              sVar14 = sVar30 - sVar13;
              if ((uVar21 == 0) || (sVar14 == 0)) {
                sVar32 = local_a0 - sVar14;
                if (uVar21 == 0) {
                  if (zip->tmp_stream_bytes_remaining != 0) {
                    local_e4 = 1;
                  }
                  uVar22 = 0;
                  bVar34 = false;
                  in_R11 = (ulong)local_e4;
                }
                else {
                  uVar22 = 0;
                  bVar34 = false;
                  in_R11 = (ulong)local_e4;
                }
              }
              else {
                in_R11 = in_R11 & 0xffffffff;
                local_b0 = local_b0 + sVar13;
                bVar34 = true;
                sVar30 = sVar14;
              }
            }
            if (!bVar34) goto LAB_00606d55;
          }
          sVar14 = zip->tmp_stream_buff_size;
          puVar27 = zip->tmp_stream_buff;
        }
        uVar6 = zip->codec;
        if ((long)uVar6 < 0x30401) {
          if (uVar6 == 0) {
            uVar31 = sVar14;
            if (uVar16 < sVar14) {
              uVar31 = uVar16;
            }
            memcpy(puVar27,__src,uVar31);
            sVar28 = uVar16 - uVar31;
            sVar14 = sVar14 - uVar31;
            if (uVar21 == 0) {
              local_e4 = 1;
            }
          }
          else {
            if ((uVar6 != 0x21) && (uVar6 != 0x30101)) {
LAB_0060691a:
              pcVar19 = "Decompression internal error";
              goto LAB_006069f3;
            }
            (zip->lzstream).next_in = __src;
            (zip->lzstream).avail_in = uVar16;
            (zip->lzstream).next_out = puVar27;
            (zip->lzstream).avail_out = sVar14;
            lVar8 = lzma_code(local_78,LZMA_RUN);
            if (lVar8 != LZMA_OK) {
              if (lVar8 != LZMA_STREAM_END) {
                pcVar19 = "Decompression failed(%d)";
LAB_00606a0d:
                archive_set_error(&a->archive,-1,pcVar19,(ulong)lVar8);
LAB_00606a16:
                in_R11 = 0xffffffe7;
                goto LAB_00606d55;
              }
              lzma_end(local_78);
              zip->lzstream_valid = 0;
              local_e4 = 1;
            }
            sVar28 = (zip->lzstream).avail_in;
            sVar14 = (zip->lzstream).avail_out;
          }
        }
        else if (uVar6 == 0x30401) {
          sVar28 = uVar16;
          if (((zip->ppmd7_valid == 0) || (iVar9 = zip->ppmd7_stat, iVar9 < 0)) || (sVar14 == 0)) {
            bVar34 = false;
            archive_set_error(&a->archive,-1,"Decompression internal error");
            in_R11 = 0xffffffe7;
          }
          else {
            (zip->ppstream).next_in = __src;
            (zip->ppstream).avail_in = uVar16;
            (zip->ppstream).next_out = puVar27;
            (zip->ppstream).avail_out = sVar14;
            if (iVar9 == 0) {
              (zip->bytein).a = a;
              (zip->bytein).Read = ppmd_read;
              (zip->range_dec).Stream = local_68;
              BVar10 = (*local_70)(local_80);
              if (BVar10 == 0) {
                zip->ppmd7_stat = -1;
                archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decoder");
              }
              else {
                if ((zip->ppstream).overconsumed == 0) {
                  zip->ppmd7_stat = 1;
                  in_R11 = in_R11 & 0xffffffff;
                  goto LAB_00606903;
                }
                zip->ppmd7_stat = -1;
              }
              bVar34 = false;
              in_R11 = 0xffffffe7;
            }
            else {
LAB_00606903:
              if (uVar21 == 0) {
                local_b8 = zip->folder_outbytes_remaining;
              }
              else {
                local_b8 = 0;
              }
              do {
                iVar9 = (*local_40)(local_48,&local_80->p);
                if (iVar9 < 0) {
                  zip->ppmd7_stat = -1;
                  bVar34 = false;
                  archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
                  in_R11 = 0xffffffe7;
                }
                else if ((zip->ppstream).overconsumed == 0) {
                  in_R11 = in_R11 & 0xffffffff;
                  puVar27 = (zip->ppstream).next_out;
                  (zip->ppstream).next_out = puVar27 + 1;
                  *puVar27 = (uchar)iVar9;
                  piVar3 = &(zip->ppstream).avail_out;
                  *piVar3 = *piVar3 + -1;
                  piVar3 = &(zip->ppstream).total_out;
                  *piVar3 = *piVar3 + 1;
                  bVar34 = local_b8 == 0;
                  local_b8 = local_b8 - 1;
                  if (bVar34) {
                    local_b8 = 0;
                  }
                  bVar34 = true;
                }
                else {
                  zip->ppmd7_stat = -1;
                  in_R11 = 0xffffffe7;
                  bVar34 = false;
                }
                if (!bVar34) {
                  bVar34 = false;
                  goto LAB_006069c1;
                }
                sVar17 = (zip->ppstream).avail_out;
              } while ((sVar17 != 0) && ((zip->ppstream).avail_in != 0 || local_b8 != 0));
              bVar34 = true;
              sVar14 = sVar17;
              sVar28 = (zip->ppstream).avail_in;
            }
          }
LAB_006069c1:
          if (!bVar34) goto LAB_00606d55;
        }
        else {
          if (uVar6 == 0x40108) {
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uint)uVar16;
            (zip->stream).next_out = puVar27;
            (zip->stream).avail_out = (uint)sVar14;
            lVar8 = cm_zlib_inflate(local_50,0);
            if (lVar8 != LZMA_OK) {
              if (lVar8 != LZMA_STREAM_END) {
                pcVar19 = "File decompression failed (%d)";
                goto LAB_00606a0d;
              }
              local_e4 = 1;
            }
            sVar28 = (size_t)(zip->stream).avail_in;
            sVar14 = (size_t)(zip->stream).avail_out;
            goto LAB_00606a4f;
          }
          if (uVar6 != 0x40202) goto LAB_0060691a;
          (zip->bzstream).next_in = (char *)__src;
          (zip->bzstream).avail_in = (uint)uVar16;
          (zip->bzstream).next_out = (char *)puVar27;
          (zip->bzstream).avail_out = (uint)sVar14;
          iVar9 = BZ2_bzDecompress(local_88);
          if (iVar9 != 0) {
            if (iVar9 == 4) {
              iVar9 = BZ2_bzDecompressEnd(local_88);
              if (iVar9 == 0) {
                zip->bzstream_valid = 0;
                local_e4 = 1;
                goto LAB_00606a3c;
              }
              pcVar19 = "Failed to clean up decompressor";
            }
            else {
              pcVar19 = "bzip decompression failed";
            }
LAB_006069f3:
            archive_set_error(&a->archive,-1,pcVar19);
            goto LAB_00606a16;
          }
LAB_00606a3c:
          sVar28 = (size_t)(zip->bzstream).avail_in;
          sVar14 = (size_t)(zip->bzstream).avail_out;
        }
LAB_00606a4f:
        uVar31 = local_a0 - sVar14;
        sVar32 = uVar31;
        if ((zip->codec != 0x21) && (zip->codec2 == 0x3030103)) {
          if (uVar31 < 5) {
            sVar32 = 0;
          }
          else {
            sVar17 = zip->bcj_prevPosT;
            uVar15 = (ulong)zip->bcj_prevMask;
            uVar5 = zip->bcj_ip;
            pbVar29 = puVar11 + (uVar31 - 4);
            local_90 = ((local_90 + sVar14) - local_38) + 5;
            sVar32 = 0;
            do {
              pbVar24 = puVar11 + sVar32;
              bVar34 = pbVar24 < pbVar29;
              if ((bVar34) && (bVar34 = true, (*pbVar24 & 0xfe) != 0xe8)) {
                lVar33 = sVar32 + local_90;
                pbVar23 = pbVar24;
                do {
                  pbVar24 = pbVar29;
                  if (lVar33 == 0) break;
                  pbVar24 = pbVar23 + 1;
                  lVar33 = lVar33 + 1;
                  pbVar23 = pbVar24;
                } while ((*pbVar24 & 0xfe) != 0xe8);
                bVar34 = pbVar24 < pbVar29;
              }
              sVar32 = (long)pbVar24 - (long)puVar11;
              if (bVar34) {
                sVar17 = sVar32 - sVar17;
                if (sVar17 < 4) {
                  uVar25 = (int)uVar15 << ((char)sVar17 - 1U & 0x1f);
                  uVar26 = uVar25 & 7;
                  if (uVar26 == 0) goto LAB_00606b8b;
                  bVar35 = (0xe8U >> uVar26 & 1) != 0;
                  bVar36 = (byte)(pbVar24[4 - (ulong)(byte)(&x86_Convert_kMaskToBitNumber)[uVar26]]
                                 + 1) < 2;
                  uVar25 = (uVar25 & 3) * 2 + 1;
                  if (!bVar36 && !bVar35) {
                    uVar25 = uVar26;
                  }
                  uVar15 = (ulong)uVar25;
                  if (bVar36 || bVar35) {
                    sVar17 = sVar32;
                  }
                  sVar32 = sVar32 + (bVar36 || bVar35);
                  if (bVar36 || bVar35) goto LAB_00606c4a;
                }
                else {
LAB_00606b8b:
                  uVar15 = 0;
                }
                sVar17 = sVar32;
                bVar4 = pbVar24[4];
                if ((bVar4 == 0xff) || (bVar4 == 0)) {
                  uVar25 = (uint)pbVar24[1] |
                           (uint)pbVar24[2] << 8 | (uint)pbVar24[3] << 0x10 | (uint)bVar4 << 0x18;
                  do {
                    uVar26 = uVar25 - (uVar5 + (int)sVar17);
                    if ((uint)uVar15 == 0) {
                      bVar35 = false;
                    }
                    else {
                      uVar20 = uVar26 >> ((&x86_Convert_kMaskToBitNumber)[uVar15] * -8 + 0x18U &
                                         0x1f);
                      if (((char)uVar20 == -1) || ((uVar20 & 0xff) == 0)) {
                        uVar25 = ~(-1 << ((&x86_Convert_kMaskToBitNumber)[uVar15] * -8 & 0x1fU) ^
                                  uVar26);
                        bVar35 = true;
                      }
                      else {
                        bVar35 = false;
                      }
                    }
                  } while (bVar35);
                  pbVar24[4] = (byte)((int)(uVar26 * 0x80) >> 0x1f);
                  pbVar24[3] = (byte)(uVar26 >> 0x10);
                  pbVar24[2] = (byte)(uVar26 >> 8);
                  pbVar24[1] = (byte)uVar26;
                  sVar32 = sVar17 + 5;
                }
                else {
                  uVar15 = (ulong)(((uint)uVar15 & 3) * 2 + 1);
                  sVar32 = sVar17 + 1;
                }
              }
LAB_00606c4a:
            } while (bVar34);
            zip->bcj_prevPosT = sVar17;
            zip->bcj_prevMask = (uint32_t)uVar15;
            zip->bcj_ip = zip->bcj_ip + (int)sVar32;
            local_98 = sVar28;
          }
          sVar18 = uVar31 - sVar32;
          zip->odd_bcj_size = sVar18;
          if ((((sVar18 == 0) || (local_e4 != 0)) || (4 < sVar18)) || (uVar21 == 0)) {
            zip->odd_bcj_size = 0;
            sVar32 = uVar31;
          }
          else {
            local_98 = sVar28;
            memcpy(local_60,puVar11 + sVar32,sVar18);
            sVar28 = local_98;
          }
        }
        uVar22 = uVar16 - sVar28;
        if (zip->codec2 == 0x303011b) {
          uVar21 = zip->tmp_stream_buff_size - sVar14;
          if (zip->main_stream_bytes_remaining <= uVar21) {
            uVar21 = zip->main_stream_bytes_remaining;
          }
          zip->tmp_stream_bytes_avail = uVar21;
          zip->tmp_stream_bytes_remaining = uVar21;
          sVar13 = Bcj2_Decode(zip,local_b0,sVar30);
          if (sVar13 < 0) {
            archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
            in_R11 = 0xffffffe7;
            goto LAB_00606d55;
          }
          zip->main_stream_bytes_remaining =
               zip->main_stream_bytes_remaining +
               (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
          sVar32 = (local_a0 - sVar30) + sVar13;
        }
        in_R11 = (ulong)local_e4;
      }
      else {
        if ((local_a0 < 5 && uVar21 != 0) && (zip->odd_bcj_size != 0)) {
          local_e4 = 0;
          bVar34 = false;
          in_R11 = 0;
          sVar32 = 0;
          uVar22 = 0;
        }
        else {
          if (local_a0 != 0 && zip->odd_bcj_size != 0) {
            lVar33 = 0;
            do {
              puVar11[lVar33] = zip->odd_bcj[lVar33];
              lVar1 = lVar33 + 1;
              psVar2 = &zip->odd_bcj_size;
              *psVar2 = *psVar2 - 1;
              if (*psVar2 == 0) break;
              bVar34 = local_a0 - 1 != lVar33;
              lVar33 = lVar1;
            } while (bVar34);
            local_b0 = puVar11 + lVar1;
            sVar30 = local_a0 - lVar1;
          }
          if ((uVar21 == 0) || (sVar30 == 0)) {
            in_R11 = (ulong)(uVar21 == 0);
            sVar32 = local_a0 - sVar30;
            uVar22 = 0;
            bVar34 = false;
            local_e4 = (uint)(uVar21 == 0);
          }
          else {
            local_e4 = 0;
            bVar34 = true;
          }
        }
        if (bVar34) goto LAB_00606620;
      }
LAB_00606d55:
      iVar9 = 1;
      if ((uint)in_R11 < 2) {
        uVar7 = zip->pack_stream_inbytes_remaining;
        zip->pack_stream_inbytes_remaining = uVar7 - uVar22;
        uVar21 = zip->folder_outbytes_remaining;
        uVar16 = uVar21;
        if (sVar32 < uVar21) {
          uVar16 = sVar32;
        }
        zip->folder_outbytes_remaining = uVar21 - uVar16;
        sVar30 = zip->uncompressed_buffer_bytes_remaining + uVar16;
        zip->uncompressed_buffer_bytes_remaining = sVar30;
        zip->pack_stream_bytes_unconsumed = uVar22;
        iVar9 = 2;
        if ((sVar30 != zip->uncompressed_buffer_size) &&
           ((((iVar9 = 2, zip->codec2 != 0x3030103 || (sVar30 + 5 <= zip->uncompressed_buffer_size))
             || (zip->odd_bcj_size == 0)) && ((uVar7 != uVar22 || (sVar32 < uVar21)))))) {
          if (((uint)in_R11 != 0) || (uVar16 == 0 && uVar22 == 0)) {
            iVar9 = -1;
            pcVar19 = "Damaged 7-Zip archive";
            goto LAB_0060651c;
          }
          read_consume(a);
          iVar9 = 0;
        }
      }
    }
  } while (iVar9 == 0);
  if (iVar9 != 2) {
    return -0x1e;
  }
  if (local_58 <= zip->uncompressed_buffer_bytes_remaining) {
    zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
    return 0;
  }
  pcVar19 = "Damaged 7-Zip archive";
  iVar9 = -1;
LAB_00607035:
  archive_set_error(&a->archive,iVar9,pcVar19);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}